

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O2

void g_tree_foreach(GTree *tree,GTraverseFunc func,gpointer user_data)

{
  gboolean gVar1;
  GTreeNode *node;
  
  if (tree->root != (GTreeNode *)0x0) {
    node = g_tree_first_node(tree);
    while ((node != (GTreeNode *)0x0 &&
           (gVar1 = (*func)(node->key,node->value,user_data), gVar1 == 0))) {
      node = g_tree_node_next(node);
    }
  }
  return;
}

Assistant:

void g_tree_foreach (GTree *tree, GTraverseFunc func, gpointer user_data)
{
    GTreeNode *node;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
        return;

    node = g_tree_first_node (tree);

    while (node)
    {
        if ((*func) (node->key, node->value, user_data))
            break;

        node = g_tree_node_next (node);
    }
}